

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O1

Try<tl::expected<void,_std::errc>_> * __thiscall
async_simple::coro::detail::LazyPromise<tl::expected<void,_std::errc>_>::tryResult
          (Try<tl::expected<void,_std::errc>_> *__return_storage_ptr__,
          LazyPromise<tl::expected<void,_std::errc>_> *this)

{
  variant_alternative_t<1UL,_variant<monostate,_expected<void,_errc>,_exception_ptr>_> *pvVar1;
  
  if (*(__index_type *)
       ((long)&(this->_value).
               super__Variant_base<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
               .
               super__Move_assign_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
               .
               super__Copy_assign_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
               .
               super__Move_ctor_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
               .
               super__Copy_ctor_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
               .
               super__Variant_storage_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
       + 8) == '\x02') {
    std::get<2ul,std::monostate,tl::expected<void,std::errc>,std::__exception_ptr::exception_ptr>
              (&this->_value);
    LazyPromise<tl::expected<void,std::errc>>::tryResult();
  }
  else {
    pvVar1 = std::
             get<1ul,std::monostate,tl::expected<void,std::errc>,std::__exception_ptr::exception_ptr>
                       (&this->_value);
    *(expected_storage_base<void,_std::errc,_false,_true> *)
     &(__return_storage_ptr__->_value).
      super__Variant_base<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
      .
      super__Move_assign_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
      .
      super__Copy_assign_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
      .
      super__Move_ctor_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
      .
      super__Copy_ctor_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
      .
      super__Variant_storage_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
         = (pvVar1->super_expected_move_assign_base<void,_std::errc,_true>).
           super_expected_copy_assign_base<void,_std::errc,_true>.
           super_expected_move_base<void,_std::errc,_true>.
           super_expected_copy_base<void,_std::errc,_true>.
           super_expected_operations_base<void,_std::errc>.
           super_expected_storage_base<void,_std::errc,_false,_true>;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->_value).
             super__Variant_base<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
             .
             super__Move_assign_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
             .
             super__Copy_assign_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
             .
             super__Move_ctor_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
             .
             super__Copy_ctor_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
             .
             super__Variant_storage_alias<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
     + 8) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }